

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O0

Transform * iDynTree::TransformFromDH(double a,double alpha,double d,double theta)

{
  Transform *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double sa;
  double ca;
  double st;
  double ct;
  Position local_a8 [24];
  Rotation local_90 [72];
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_28 = in_XMM3_Qa;
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  local_30 = cos(in_XMM3_Qa);
  local_38 = sin(local_28);
  local_48 = sin(local_18);
  local_40 = cos(local_18);
  iDynTree::Rotation::Rotation
            (local_90,local_30,-local_38 * local_40,local_38 * local_48,local_38,local_30 * local_40
             ,-local_30 * local_48,0.0,local_48,local_40);
  iDynTree::Position::Position(local_a8,local_10 * local_30,local_10 * local_38,local_20);
  iDynTree::Transform::Transform(in_RDI,local_90,local_a8);
  return in_RDI;
}

Assistant:

Transform TransformFromDH(double a,double alpha,double d,double theta)
// returns Denavit-Hartenberg parameters (Non-Modified DH)
{
        double ct,st,ca,sa;
        ct = cos(theta);
        st = sin(theta);
        sa = sin(alpha);
        ca = cos(alpha);
        return Transform(Rotation(ct,    -st*ca,   st*sa,
                                  st,     ct*ca,  -ct*sa,
                                   0,        sa,      ca   ),
                         Position(a*ct,      a*st,  d));
}